

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O0

void __thiscall
xLearn::Loss::CalcGradDist
          (Loss *this,DMatrix *matrix,Model *model,vector<float,_std::allocator<float>_> *grad)

{
  index_t iVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  bool bVar2;
  bool in_stack_00000017;
  size_t in_stack_00000018;
  vector<unsigned_int,_std::allocator<unsigned_int>_> feature_list;
  index_t len;
  DMatrix mini_batch;
  undefined4 in_stack_ffffffffffffff30;
  DMatrix *in_stack_ffffffffffffff48;
  index_t in_stack_ffffffffffffff54;
  DMatrix *in_stack_ffffffffffffff58;
  DMatrix *in_stack_ffffffffffffff70;
  
  do {
    DMatrix::DMatrix(in_stack_ffffffffffffff70);
    DMatrix::ReAlloc((DMatrix *)
                     feature_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start,in_stack_00000018,in_stack_00000017);
    iVar1 = DMatrix::GetMiniBatch
                      (in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,in_stack_ffffffffffffff48
                      );
    bVar2 = iVar1 != 0;
    if (bVar2) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1d135d);
      DMatrix::Compress((DMatrix *)this,
                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)matrix);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_RDI);
    }
    DMatrix::~DMatrix((DMatrix *)CONCAT44(iVar1,in_stack_ffffffffffffff30));
  } while (bVar2);
  return;
}

Assistant:

void Loss::CalcGradDist(DMatrix* matrix,
                        Model& model,
                        std::vector<real_t>& grad) {
  for(;;) {
    // Get a mini-batch from current data matrix
    DMatrix mini_batch;
    mini_batch.ReAlloc(batch_size_);
    index_t len = matrix->GetMiniBatch(batch_size_, mini_batch);
    if (len == 0) {
      break;
    }
    mini_batch.row_length = len;
    // Compress the sparse data matrix and sparse model
    // parameter to dense format
    std::vector<index_t> feature_list;
    mini_batch.Compress(feature_list);
    /*
    // Pull the model parameter from parameter server
    store->pull(feature_list, model);

    // Calculate gradient
    this->CalcGrad(matrix, model, grad);

    // Push gradient to the parameter server
    ps->push(grad, feature_list);
    */
  }
}